

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtenvironmentvariables.cpp
# Opt level: O1

bool qLocalTime(time_t utc,tm *local)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  tm *ptVar11;
  long in_FS_OFFSET;
  time_t local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = utc;
  ptVar11 = localtime(&local_18);
  if (ptVar11 != (tm *)0x0) {
    local->tm_zone = ptVar11->tm_zone;
    iVar1 = ptVar11->tm_sec;
    iVar2 = ptVar11->tm_min;
    iVar3 = ptVar11->tm_hour;
    iVar4 = ptVar11->tm_mday;
    iVar7 = ptVar11->tm_mon;
    iVar8 = ptVar11->tm_year;
    iVar9 = ptVar11->tm_wday;
    iVar10 = ptVar11->tm_yday;
    uVar6 = *(undefined4 *)&ptVar11->field_0x24;
    lVar5 = ptVar11->tm_gmtoff;
    local->tm_isdst = ptVar11->tm_isdst;
    *(undefined4 *)&local->field_0x24 = uVar6;
    local->tm_gmtoff = lVar5;
    local->tm_mon = iVar7;
    local->tm_year = iVar8;
    local->tm_wday = iVar9;
    local->tm_yday = iVar10;
    local->tm_sec = iVar1;
    local->tm_min = iVar2;
    local->tm_hour = iVar3;
    local->tm_mday = iVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return ptVar11 != (tm *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool qLocalTime(time_t utc, struct tm *local)
{
    const auto locker = qt_scoped_lock(environmentMutex);
#if defined(Q_OS_WIN)
    // The doc of localtime_s() says that it corrects for the same things
    // _tzset() sets the globals for, but QTBUG-109974 reveals a need for an
    // explicit call, all the same.
    _tzset();
    return !localtime_s(local, &utc);
#elif QT_CONFIG(thread) && defined(_POSIX_THREAD_SAFE_FUNCTIONS)
    // Use the reentrant version of localtime() where available, as it is
    // thread-safe and doesn't use a shared static data area.
    // As localtime_r() is not specified to work as if it called tzset(),
    // make an explicit call.
    tzset();
    if (tm *res = localtime_r(&utc, local)) {
        Q_ASSERT(res == local);
        Q_UNUSED(res);
        return true;
    }
    return false;
#else
    // POSIX mandates that localtime() behaves as if it called tzset().
    // Returns shared static data which may be overwritten at any time (albeit
    // our lock probably keeps it safe). So copy the result promptly:
    if (tm *res = localtime(&utc)) {
        *local = *res;
        return true;
    }
    return false;
#endif
}